

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O0

int libtorrent::ed25519_verify
              (uchar *signature,uchar *message,ptrdiff_t message_len,uchar *public_key)

{
  int iVar1;
  uchar *puVar2;
  undefined1 local_2c8 [8];
  sha512_hash h;
  span<const_char> local_278 [2];
  span<const_char> local_258;
  undefined1 local_248 [8];
  hasher512 hash;
  ge_p2 R;
  ge_p3 A;
  uchar checker [32];
  uchar *public_key_local;
  ptrdiff_t message_len_local;
  uchar *message_local;
  uchar *signature_local;
  
  if ((signature[0x3f] & 0xe0) == 0) {
    iVar1 = ge_frombytes_negate_vartime((ge_p3 *)(R.Z + 8),public_key);
    if (iVar1 == 0) {
      hasher512::hasher512((hasher512 *)local_248);
      span<const_char>::span(&local_258,(char *)signature,0x20);
      hasher512::update((hasher512 *)local_248,local_258);
      span<const_char>::span(local_278,(char *)public_key,0x20);
      hasher512::update((hasher512 *)local_248,local_278[0]);
      span<const_char>::span
                ((span<const_char> *)(h.m_number._M_elems + 0xe),(char *)message,message_len);
      hasher512::update((hasher512 *)local_248,stack0xfffffffffffffd78);
      hasher512::final((sha512_hash *)local_2c8,(hasher512 *)local_248);
      puVar2 = (uchar *)digest32<512L>::data((digest32<512L> *)local_2c8);
      sc_reduce(puVar2);
      puVar2 = (uchar *)digest32<512L>::data((digest32<512L> *)local_2c8);
      ge_double_scalarmult_vartime
                ((ge_p2 *)&hash.m_context.num,puVar2,(ge_p3 *)(R.Z + 8),signature + 0x20);
      ge_tobytes((uchar *)(A.T + 8),(ge_p2 *)&hash.m_context.num);
      iVar1 = consttime_equal((uchar *)(A.T + 8),signature);
      signature_local._4_4_ = (uint)(iVar1 != 0);
      hasher512::~hasher512((hasher512 *)local_248);
    }
    else {
      signature_local._4_4_ = 0;
    }
  }
  else {
    signature_local._4_4_ = 0;
  }
  return signature_local._4_4_;
}

Assistant:

int ed25519_verify(const unsigned char *signature, const unsigned char *message, std::ptrdiff_t message_len, const unsigned char *public_key) {
    unsigned char checker[32];
    ge_p3 A;
    ge_p2 R;

    if (signature[63] & 224) {
        return 0;
    }

    if (ge_frombytes_negate_vartime(&A, public_key) != 0) {
        return 0;
    }

    hasher512 hash;
    hash.update({reinterpret_cast<char const*>(signature), 32});
    hash.update({reinterpret_cast<char const*>(public_key), 32});
    hash.update({reinterpret_cast<char const*>(message), message_len});
    sha512_hash h = hash.final();
    
    sc_reduce(reinterpret_cast<unsigned char*>(h.data()));
    ge_double_scalarmult_vartime(&R, reinterpret_cast<unsigned char*>(h.data())
        , &A, signature + 32);
    ge_tobytes(checker, &R);

    if (!consttime_equal(checker, signature)) {
        return 0;
    }

    return 1;
}